

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_model_set.c
# Opt level: O2

ngram_model_t * ngram_model_set_remove(ngram_model_t *base,char *name,int reuse_widmap)

{
  byte bVar1;
  uint32 *puVar2;
  void *pvVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  ngram_model_t *pnVar9;
  uint uVar10;
  ulong uVar11;
  float64 fVar12;
  
  uVar10 = base[1].refcount;
  uVar11 = 0;
  uVar8 = 0;
  if (0 < (int)uVar10) {
    uVar8 = (ulong)uVar10;
  }
  do {
    if (uVar8 == uVar11) {
LAB_0012edf3:
      if ((uint)uVar8 == uVar10) {
        pnVar9 = (ngram_model_t *)0x0;
      }
      else {
        pnVar9 = *(ngram_model_t **)(base[1].n_counts + uVar8 * 2);
        fVar12 = logmath_exp(base->lmath,*(int *)(*(long *)&base[1].n + uVar8 * 4));
        iVar4 = logmath_log(base->lmath,(float64)(1.0 - (double)(float)(double)fVar12));
        base[1].refcount = base[1].refcount + -1;
        ckd_free(*(void **)(*(long *)&base[1].n_1g_alloc + uVar8 * 8));
        *(undefined8 *)(*(long *)&base[1].n_1g_alloc + uVar8 * 8) = 0;
        uVar11 = 0;
        uVar10 = 0;
        while (lVar5 = (long)base[1].refcount, (long)uVar11 < lVar5) {
          if (uVar11 < uVar8) {
            lVar5 = *(long *)&base[1].n;
            iVar7 = *(int *)(lVar5 + uVar11 * 4);
          }
          else {
            *(undefined8 *)(base[1].n_counts + uVar11 * 2) =
                 *(undefined8 *)(base[1].n_counts + uVar11 * 2 + 2);
            *(undefined8 *)(*(long *)&base[1].n_1g_alloc + uVar11 * 8) =
                 *(undefined8 *)(*(long *)&base[1].n_1g_alloc + 8 + uVar11 * 8);
            lVar5 = *(long *)&base[1].n;
            iVar7 = *(int *)(lVar5 + 4 + uVar11 * 4);
            *(int *)(lVar5 + uVar11 * 4) = iVar7;
          }
          uVar6 = uVar11 + 1;
          *(int *)(lVar5 + uVar11 * 4) = iVar7 - iVar4;
          bVar1 = *(byte *)(*(long *)(base[1].n_counts + uVar11 * 2) + 0x18);
          uVar11 = uVar6;
          if (uVar10 <= bVar1) {
            uVar10 = (uint)bVar1;
          }
        }
        puVar2 = base[1].n_counts;
        (puVar2 + lVar5 * 2)[0] = 0;
        (puVar2 + lVar5 * 2)[1] = 0;
        *(int32 *)(*(long *)&base[1].n + lVar5 * 4) = base->log_zero;
        if (reuse_widmap == 0) {
          build_widmap(base,base->lmath,uVar10);
        }
        else {
          for (lVar5 = 0; lVar5 < base->n_words; lVar5 = lVar5 + 1) {
            pvVar3 = (&((base[1].lmath)->t).table)[lVar5];
            memmove((void *)((long)pvVar3 + uVar8 * 4),(void *)((long)pvVar3 + uVar8 * 4 + 4),
                    ((long)base[1].refcount - (long)(int)(uint)uVar8) * 4);
          }
        }
      }
      return pnVar9;
    }
    iVar4 = strcmp(name,*(char **)(*(long *)&base[1].n_1g_alloc + uVar11 * 8));
    if (iVar4 == 0) {
      uVar8 = uVar11 & 0xffffffff;
      goto LAB_0012edf3;
    }
    uVar11 = uVar11 + 1;
  } while( true );
}

Assistant:

ngram_model_t *
ngram_model_set_remove(ngram_model_t * base,
                       const char *name, int reuse_widmap)
{
    ngram_model_set_t *set = (ngram_model_set_t *) base;
    ngram_model_t *submodel;
    int32 lmidx, scale, n, i;
    float32 fprob;

    for (lmidx = 0; lmidx < set->n_models; ++lmidx)
        if (0 == strcmp(name, set->names[lmidx]))
            break;
    if (lmidx == set->n_models)
        return NULL;
    submodel = set->lms[lmidx];

    /* Renormalize the interpolation weights by scaling them by
     * 1/(1-fprob) */
    fprob = (float32) logmath_exp(base->lmath, set->lweights[lmidx]);
    scale = logmath_log(base->lmath, 1.0 - fprob);

    /* Remove it from the array of lms, renormalize remaining weights,
     * and recalcluate n. */
    --set->n_models;
    n = 0;
    ckd_free(set->names[lmidx]);
    set->names[lmidx] = NULL;
    for (i = 0; i < set->n_models; ++i) {
        if (i >= lmidx) {
            set->lms[i] = set->lms[i + 1];
            set->names[i] = set->names[i + 1];
            set->lweights[i] = set->lweights[i + 1];
        }
        set->lweights[i] -= scale;
        if (set->lms[i]->n > n)
            n = set->lms[i]->n;
    }
    /* There's no need to shrink these arrays. */
    set->lms[set->n_models] = NULL;
    set->lweights[set->n_models] = base->log_zero;
    /* No need to shrink maphist either. */

    /* Reuse the existing word ID mapping if requested. */
    if (reuse_widmap) {
        /* Just go through and shrink each row. */
        for (i = 0; i < base->n_words; ++i) {
            memmove(set->widmap[i] + lmidx, set->widmap[i] + lmidx + 1,
                    (set->n_models - lmidx) * sizeof(**set->widmap));
        }
    }
    else {
        build_widmap(base, base->lmath, n);
    }
    return submodel;
}